

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O3

void __thiscall QOpenGLTexture::setMipLevels(QOpenGLTexture *this,int levels)

{
  Target TVar1;
  QOpenGLTexturePrivate *this_00;
  
  this_00 = (this->d_ptr).d;
  QOpenGLTexturePrivate::create(this_00);
  if (((this->d_ptr).d)->storageAllocated == true) {
    setMipLevels();
    return;
  }
  TVar1 = this_00->target;
  if ((int)TVar1 < 0x8c18) {
    if ((int)TVar1 < 0x806f) {
      if (1 < TVar1 - Target1D) {
        return;
      }
    }
    else if ((TVar1 != Target3D) && (TVar1 != TargetCubeMap)) {
      if (TVar1 != TargetRectangle) {
        return;
      }
      goto LAB_001580e7;
    }
  }
  else {
    if (0x8c29 < (int)TVar1) {
      if ((int)TVar1 < 0x9100) {
        if (TVar1 == TargetCubeMapArray) goto LAB_001580bf;
        if (TVar1 != TargetBuffer) {
          return;
        }
      }
      else if ((TVar1 != Target2DMultisample) && (TVar1 != Target2DMultisampleArray)) {
        return;
      }
LAB_001580e7:
      setMipLevels();
      return;
    }
    if ((TVar1 != Target1DArray) && (TVar1 != Target2DArray)) {
      return;
    }
  }
LAB_001580bf:
  this_00->requestedMipLevels = levels;
  return;
}

Assistant:

void QOpenGLTexture::setMipLevels(int levels)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (isStorageAllocated()) {
        qWarning("Cannot set mip levels on a texture that already has storage allocated.\n"
                 "To do so, destroy() the texture and then create() and setMipLevels()");
        return;
    }

    switch (d->target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
    case QOpenGLTexture::Target3D:
        d->requestedMipLevels = levels;
        break;

    case QOpenGLTexture::TargetBuffer:
    case QOpenGLTexture::TargetRectangle:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
        qWarning("QAbstractOpenGLTexture::setMipLevels(): This texture target does not support mipmaps");
        break;
    }
}